

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getEdgeId(RDL_data *data,uint from,uint to)

{
  RDL_graph *gra;
  uint uVar1;
  char *pcVar2;
  
  if (data == (RDL_data *)0x0) {
    pcVar2 = "RDL_data is NULL!\n";
  }
  else {
    gra = data->graph;
    if (gra != (RDL_graph *)0x0) {
      if (gra->V <= from || gra->V <= to) {
        (*RDL_outputFunc)(RDL_ERROR,"invalid edge %u %u\n");
        return 0xffffffff;
      }
      uVar1 = RDL_edgeId(gra,from,to);
      return uVar1;
    }
    pcVar2 = "RDL_graph is NULL!\n";
  }
  (*RDL_outputFunc)(RDL_ERROR,pcVar2);
  return 0xffffffff;
}

Assistant:

unsigned RDL_getEdgeId(const RDL_data *data, unsigned from, unsigned to)
{
  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if (!data->graph) {
    RDL_outputFunc(RDL_ERROR, "RDL_graph is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if (from >= data->graph->V || to >= data->graph->V) {
    RDL_outputFunc(RDL_ERROR, "invalid edge %u %u\n", from, to);
    return RDL_INVALID_RESULT;
  }

  return RDL_edgeId(data->graph, from, to);
}